

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void searchlight_movement(searchlight_movement_t *slstate)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  
  uVar1 = (slstate->xy).x;
  uVar2 = (slstate->xy).y;
  puVar3 = &slstate->counter;
  *puVar3 = *puVar3 + 0xff;
  if (*puVar3 != '\0') {
    bVar5 = slstate->index >> 6 & 2;
    bVar6 = bVar5 ^ slstate->direction;
    cVar4 = -2;
    if (slstate->direction != bVar5) {
      cVar4 = (bVar6 != 3) * '\x04' + -2;
    }
    (slstate->xy).x = cVar4 + uVar1;
    (slstate->xy).y = (-(bVar6 < 2) | 1U) + uVar2;
    return;
  }
  bVar5 = slstate->index;
  if ((char)bVar5 < '\0') {
    if ((bVar5 & 0x7f) == 0) {
      slstate->index = '\0';
      bVar5 = 0;
    }
    else {
      slstate->index = bVar5 - 1;
      bVar5 = (bVar5 & 0x7f) - 1;
    }
  }
  else {
    bVar5 = bVar5 + 1;
    slstate->index = bVar5;
  }
  puVar3 = slstate->ptr + (ulong)bVar5 * 2;
  if (*puVar3 == 0xff) {
    slstate->index = slstate->index - 1 | 0x80;
    puVar3 = puVar3 + -2;
  }
  slstate->counter = *puVar3;
  slstate->direction = puVar3[1];
  return;
}

Assistant:

void searchlight_movement(searchlight_movement_t *slstate)
{
#define REVERSE (1 << 7)

  uint8_t        x,y;       /* was E,D */
  uint8_t        index;     /* was A */
  const uint8_t *ptr;       /* was BC */
  direction_t    direction; /* was A */

  assert(slstate != NULL);

  x = slstate->xy.x;
  y = slstate->xy.y;
  if (--slstate->counter == 0)
  {
    /* End of previous sweep: work out the next. */

    index = slstate->index; // sampled HL = $AD3B, $AD34, $AD2D
    if (index & REVERSE) /* reverse direction bit set */
    {
      index &= ~REVERSE;
      if (index == 0)
      {
        slstate->index &= ~REVERSE; /* clear direction bit when index hits zero */
      }
      else
      {
        slstate->index--; /* count down */
        index--; /* just a copy sans direction bit */
        assert(index == (slstate->index ^ REVERSE));
      }
    }
    else
    {
      slstate->index = ++index; /* count up */
    }
    assert(index <= 8); // movement_1 is the longest
    ptr = slstate->ptr + index * 2;
    if (*ptr == 255) /* end of list? */
    {
      slstate->index--; /* overshot? count down counter byte */
      slstate->index |= REVERSE; /* go negative */
      ptr -= 2;
      // A = *ptr; /* BUG: This is a flaw in original code: A is fetched but never used again. */
    }
    /* Copy counter + direction_t. */
    slstate->counter   = ptr[0];
    slstate->direction = ptr[1];
  }
  else
  {
    direction = slstate->direction;
    if (slstate->index & REVERSE) /* test sign */
      direction ^= 2; /* toggle direction */

    /* Conv: This is the [-2]+1 pattern which works out -1/+1. */
    if (direction <= direction_TOP_RIGHT) /* direction_TOP_* */
      y--;
    else
      y++;

    if (direction != direction_TOP_LEFT &&
        direction != direction_BOTTOM_LEFT)
      x += 2; /* direction_*_RIGHT */
    else
      x -= 2; /* direction_*_LEFT */

    slstate->xy.x = x; // Conv: Reversed store order.
    slstate->xy.y = y;
  }

#undef REVERSE
}